

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Color GetPixelColor(void *srcPtr,int format)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  
  switch(format) {
  case 1:
    bVar2 = *srcPtr;
    bVar5 = 0xff;
    goto LAB_00138e7d;
  case 2:
    bVar2 = *srcPtr;
    bVar5 = *(byte *)((long)srcPtr + 1);
LAB_00138e7d:
    uVar4 = (uint)bVar2;
    uVar3 = uVar4;
    break;
  case 3:
    uVar1 = *srcPtr;
    uVar3 = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    uVar4 = ((uVar1 >> 5 & 0x3f) * 0xff) / 0x3f;
    bVar2 = (byte)(((uVar1 & 0x1f) * 0xff) / 0x1f);
    goto LAB_00138e68;
  case 4:
    uVar3 = (uint)*srcPtr;
    uVar4 = (uint)*(byte *)((long)srcPtr + 1);
    bVar2 = *(byte *)((long)srcPtr + 2);
LAB_00138e68:
    bVar5 = 0xff;
    break;
  case 5:
    uVar1 = *srcPtr;
    uVar4 = ((uVar1 >> 6 & 0x1f) * 0xff) / 0x1f;
    bVar2 = (byte)(((uVar1 & 0x1f) * 0xff) / 0x1f);
    bVar5 = -((byte)uVar1 & 1);
    uVar3 = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    break;
  case 6:
    uVar1 = *srcPtr;
    uVar4 = (uint)((byte)(uVar1 >> 8) & 0xf) * 0x11;
    bVar2 = ((byte)uVar1 >> 4) * '\x11';
    bVar5 = ((byte)uVar1 & 0xf) * '\x11';
    uVar3 = (uint)(uVar1 >> 0xc) * 0x11;
    break;
  case 7:
    uVar4 = (uint)*(byte *)((long)srcPtr + 1);
    bVar2 = *(byte *)((long)srcPtr + 2);
    bVar5 = *(byte *)((long)srcPtr + 3);
    uVar3 = (uint)*srcPtr;
    break;
  default:
    bVar5 = 0;
    bVar2 = 0;
    uVar4 = 0;
    uVar3 = 0;
  }
  return (Color)(uVar3 & 0xff | (uVar4 & 0xff) << 8 | (uint)bVar2 << 0x10 | (uint)bVar5 << 0x18);
}

Assistant:

Color GetPixelColor(void *srcPtr, int format)
{
    Color col = { 0 };

    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], 255 }; break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1] }; break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 11)*255/31);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 5) & 0b0000000000111111)*255/63);
            col.b = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000011111)*255/31);
            col.a = 255;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 11)*255/31);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 6) & 0b0000000000011111)*255/31);
            col.b = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000011111)*255/31);
            col.a = (((unsigned short *)srcPtr)[0] & 0b0000000000000001)? 255 : 0;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 12)*255/15);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 8) & 0b0000000000001111)*255/15);
            col.b = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 4) & 0b0000000000001111)*255/15);
            col.a = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000001111)*255/15);

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1], ((unsigned char *)srcPtr)[2], ((unsigned char *)srcPtr)[3] }; break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1], ((unsigned char *)srcPtr)[2], 255 }; break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32: break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32G32B32: break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32: break;
        default: break;
    }

    return col;
}